

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O0

void __thiscall Math_Pow_Test::TestBody(Math_Pow_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  char *pcVar4;
  AssertionResult gtest_ar_29;
  AssertionResult gtest_ar_28;
  AssertionResult gtest_ar_27;
  AssertionResult gtest_ar_26;
  AssertionResult gtest_ar_25;
  AssertionResult gtest_ar_24;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertHelper *in_stack_fffffffffffff870;
  float v;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffff878;
  undefined1 in_stack_fffffffffffff87f;
  char *in_stack_fffffffffffff880;
  char *in_stack_fffffffffffff888;
  int iVar5;
  AssertionResult *this_01;
  undefined7 in_stack_fffffffffffff890;
  undefined1 in_stack_fffffffffffff897;
  undefined8 in_stack_fffffffffffff898;
  Type type;
  AssertHelper *in_stack_fffffffffffff8a0;
  AssertionResult *this_02;
  Message *in_stack_fffffffffffff8e8;
  AssertionResult *this_03;
  undefined7 in_stack_fffffffffffff8f0;
  undefined1 in_stack_fffffffffffff8f7;
  AssertionResult local_4b0 [2];
  undefined4 local_490;
  float local_48c;
  AssertionResult local_488 [2];
  undefined4 local_468;
  float local_464;
  AssertionResult local_460 [2];
  undefined4 local_440;
  float local_43c;
  AssertionResult local_438 [2];
  undefined4 local_418;
  float local_414;
  AssertionResult local_410 [2];
  undefined4 local_3f0;
  float local_3ec;
  AssertionResult local_3e8 [2];
  undefined4 local_3c8;
  float local_3c4;
  AssertionResult local_3c0 [2];
  undefined4 local_3a0;
  float local_39c;
  AssertionResult local_398 [2];
  undefined4 local_378;
  float local_374;
  AssertionResult local_370 [2];
  undefined4 local_350;
  float local_34c;
  AssertionResult local_348 [2];
  undefined4 local_328;
  float local_324;
  AssertionResult local_320 [2];
  undefined4 local_300;
  float local_2fc;
  AssertionResult local_2f8 [2];
  undefined4 local_2d8;
  float local_2d4;
  AssertionResult local_2d0 [2];
  undefined4 local_2b0;
  float local_2ac;
  AssertionResult local_2a8 [2];
  undefined4 local_288;
  float local_284;
  AssertionResult local_280 [2];
  undefined4 local_260;
  float local_25c;
  AssertionResult local_258 [2];
  undefined4 local_238;
  float local_234;
  AssertionResult local_230 [2];
  undefined4 local_210;
  float local_20c;
  AssertionResult local_208 [2];
  undefined4 local_1e8;
  float local_1e4;
  AssertionResult local_1e0 [2];
  undefined4 local_1c0;
  float local_1bc;
  AssertionResult local_1b8 [2];
  undefined4 local_198;
  float local_194;
  AssertionResult local_190 [2];
  undefined4 local_170;
  float local_16c;
  AssertionResult local_168 [2];
  undefined4 local_148;
  float local_144;
  AssertionResult local_140 [2];
  undefined4 local_120;
  float local_11c;
  AssertionResult local_118 [2];
  undefined4 local_f8;
  float local_f4;
  AssertionResult local_f0 [2];
  undefined4 local_d0;
  float local_cc;
  AssertionResult local_c8 [2];
  undefined4 local_a8;
  float local_a4;
  AssertionResult local_a0 [2];
  undefined4 local_80;
  float local_7c;
  AssertionResult local_78 [2];
  undefined4 local_58;
  float local_54;
  AssertionResult local_50 [3];
  undefined4 local_20;
  float local_1c;
  AssertionResult local_18;
  
  type = (Type)((ulong)in_stack_fffffffffffff898 >> 0x20);
  local_1c = pbrt::Pow<0>(2.0);
  local_20 = 1;
  testing::internal::EqHelper<false>::Compare<float,int>
            (in_stack_fffffffffffff888,in_stack_fffffffffffff880,
             (float *)CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878),
             (int *)in_stack_fffffffffffff870);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x5e3520);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff8a0,type,
               (char *)CONCAT17(in_stack_fffffffffffff897,in_stack_fffffffffffff890),
               (int)((ulong)in_stack_fffffffffffff888 >> 0x20),in_stack_fffffffffffff880);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
               in_stack_fffffffffffff8e8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff870);
    testing::Message::~Message((Message *)0x5e3583);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5e35db);
  local_54 = pbrt::Pow<1>(2.0);
  local_58 = 2;
  testing::internal::EqHelper<false>::Compare<float,int>
            (in_stack_fffffffffffff888,in_stack_fffffffffffff880,
             (float *)CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878),
             (int *)in_stack_fffffffffffff870);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_50);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x5e369e);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff8a0,type,
               (char *)CONCAT17(in_stack_fffffffffffff897,in_stack_fffffffffffff890),
               (int)((ulong)in_stack_fffffffffffff888 >> 0x20),in_stack_fffffffffffff880);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
               in_stack_fffffffffffff8e8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff870);
    testing::Message::~Message((Message *)0x5e3701);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5e3759);
  local_7c = pbrt::Pow<2>((float)((ulong)in_stack_fffffffffffff870 >> 0x20));
  local_80 = 4;
  testing::internal::EqHelper<false>::Compare<float,int>
            (in_stack_fffffffffffff888,in_stack_fffffffffffff880,
             (float *)CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878),
             (int *)in_stack_fffffffffffff870);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_78);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x5e381c);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff8a0,type,
               (char *)CONCAT17(in_stack_fffffffffffff897,in_stack_fffffffffffff890),
               (int)((ulong)in_stack_fffffffffffff888 >> 0x20),in_stack_fffffffffffff880);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
               in_stack_fffffffffffff8e8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff870);
    testing::Message::~Message((Message *)0x5e387f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5e38d7);
  local_a4 = pbrt::Pow<3>((float)((ulong)in_stack_fffffffffffff870 >> 0x20));
  local_a8 = 8;
  testing::internal::EqHelper<false>::Compare<float,int>
            (in_stack_fffffffffffff888,in_stack_fffffffffffff880,
             (float *)CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878),
             (int *)in_stack_fffffffffffff870);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x5e399a);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff8a0,type,
               (char *)CONCAT17(in_stack_fffffffffffff897,in_stack_fffffffffffff890),
               (int)((ulong)in_stack_fffffffffffff888 >> 0x20),in_stack_fffffffffffff880);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
               in_stack_fffffffffffff8e8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff870);
    testing::Message::~Message((Message *)0x5e39fd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5e3a55);
  local_cc = pbrt::Pow<4>((float)((ulong)in_stack_fffffffffffff870 >> 0x20));
  local_d0 = 0x10;
  testing::internal::EqHelper<false>::Compare<float,int>
            (in_stack_fffffffffffff888,in_stack_fffffffffffff880,
             (float *)CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878),
             (int *)in_stack_fffffffffffff870);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x5e3b18);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff8a0,type,
               (char *)CONCAT17(in_stack_fffffffffffff897,in_stack_fffffffffffff890),
               (int)((ulong)in_stack_fffffffffffff888 >> 0x20),in_stack_fffffffffffff880);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
               in_stack_fffffffffffff8e8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff870);
    testing::Message::~Message((Message *)0x5e3b7b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5e3bd3);
  local_f4 = pbrt::Pow<5>((float)((ulong)in_stack_fffffffffffff870 >> 0x20));
  local_f8 = 0x20;
  testing::internal::EqHelper<false>::Compare<float,int>
            (in_stack_fffffffffffff888,in_stack_fffffffffffff880,
             (float *)CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878),
             (int *)in_stack_fffffffffffff870);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_f0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x5e3c96);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff8a0,type,
               (char *)CONCAT17(in_stack_fffffffffffff897,in_stack_fffffffffffff890),
               (int)((ulong)in_stack_fffffffffffff888 >> 0x20),in_stack_fffffffffffff880);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
               in_stack_fffffffffffff8e8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff870);
    testing::Message::~Message((Message *)0x5e3cf9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5e3d51);
  local_11c = pbrt::Pow<6>((float)((ulong)in_stack_fffffffffffff870 >> 0x20));
  local_120 = 0x40;
  testing::internal::EqHelper<false>::Compare<float,int>
            (in_stack_fffffffffffff888,in_stack_fffffffffffff880,
             (float *)CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878),
             (int *)in_stack_fffffffffffff870);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_118);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x5e3e14);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff8a0,type,
               (char *)CONCAT17(in_stack_fffffffffffff897,in_stack_fffffffffffff890),
               (int)((ulong)in_stack_fffffffffffff888 >> 0x20),in_stack_fffffffffffff880);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
               in_stack_fffffffffffff8e8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff870);
    testing::Message::~Message((Message *)0x5e3e77);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5e3ecf);
  local_144 = pbrt::Pow<7>((float)((ulong)in_stack_fffffffffffff870 >> 0x20));
  local_148 = 0x80;
  testing::internal::EqHelper<false>::Compare<float,int>
            (in_stack_fffffffffffff888,in_stack_fffffffffffff880,
             (float *)CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878),
             (int *)in_stack_fffffffffffff870);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_140);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x5e3f92);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff8a0,type,
               (char *)CONCAT17(in_stack_fffffffffffff897,in_stack_fffffffffffff890),
               (int)((ulong)in_stack_fffffffffffff888 >> 0x20),in_stack_fffffffffffff880);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
               in_stack_fffffffffffff8e8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff870);
    testing::Message::~Message((Message *)0x5e3ff5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5e404d);
  local_16c = pbrt::Pow<8>((float)((ulong)in_stack_fffffffffffff870 >> 0x20));
  local_170 = 0x100;
  testing::internal::EqHelper<false>::Compare<float,int>
            (in_stack_fffffffffffff888,in_stack_fffffffffffff880,
             (float *)CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878),
             (int *)in_stack_fffffffffffff870);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_168);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x5e4110);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff8a0,type,
               (char *)CONCAT17(in_stack_fffffffffffff897,in_stack_fffffffffffff890),
               (int)((ulong)in_stack_fffffffffffff888 >> 0x20),in_stack_fffffffffffff880);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
               in_stack_fffffffffffff8e8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff870);
    testing::Message::~Message((Message *)0x5e4173);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5e41cb);
  local_194 = pbrt::Pow<9>((float)((ulong)in_stack_fffffffffffff870 >> 0x20));
  local_198 = 0x200;
  testing::internal::EqHelper<false>::Compare<float,int>
            (in_stack_fffffffffffff888,in_stack_fffffffffffff880,
             (float *)CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878),
             (int *)in_stack_fffffffffffff870);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_190);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x5e428e);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff8a0,type,
               (char *)CONCAT17(in_stack_fffffffffffff897,in_stack_fffffffffffff890),
               (int)((ulong)in_stack_fffffffffffff888 >> 0x20),in_stack_fffffffffffff880);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
               in_stack_fffffffffffff8e8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff870);
    testing::Message::~Message((Message *)0x5e42f1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5e4349);
  local_1bc = pbrt::Pow<10>((float)((ulong)in_stack_fffffffffffff870 >> 0x20));
  local_1c0 = 0x400;
  testing::internal::EqHelper<false>::Compare<float,int>
            (in_stack_fffffffffffff888,in_stack_fffffffffffff880,
             (float *)CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878),
             (int *)in_stack_fffffffffffff870);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x5e440c);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff8a0,type,
               (char *)CONCAT17(in_stack_fffffffffffff897,in_stack_fffffffffffff890),
               (int)((ulong)in_stack_fffffffffffff888 >> 0x20),in_stack_fffffffffffff880);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
               in_stack_fffffffffffff8e8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff870);
    testing::Message::~Message((Message *)0x5e446f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5e44c7);
  local_1e4 = pbrt::Pow<11>((float)((ulong)in_stack_fffffffffffff870 >> 0x20));
  local_1e8 = 0x800;
  testing::internal::EqHelper<false>::Compare<float,int>
            (in_stack_fffffffffffff888,in_stack_fffffffffffff880,
             (float *)CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878),
             (int *)in_stack_fffffffffffff870);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1e0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x5e458a);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff8a0,type,
               (char *)CONCAT17(in_stack_fffffffffffff897,in_stack_fffffffffffff890),
               (int)((ulong)in_stack_fffffffffffff888 >> 0x20),in_stack_fffffffffffff880);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
               in_stack_fffffffffffff8e8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff870);
    testing::Message::~Message((Message *)0x5e45ed);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5e4645);
  local_20c = pbrt::Pow<12>((float)((ulong)in_stack_fffffffffffff870 >> 0x20));
  local_210 = 0x1000;
  testing::internal::EqHelper<false>::Compare<float,int>
            (in_stack_fffffffffffff888,in_stack_fffffffffffff880,
             (float *)CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878),
             (int *)in_stack_fffffffffffff870);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_208);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x5e4708);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff8a0,type,
               (char *)CONCAT17(in_stack_fffffffffffff897,in_stack_fffffffffffff890),
               (int)((ulong)in_stack_fffffffffffff888 >> 0x20),in_stack_fffffffffffff880);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
               in_stack_fffffffffffff8e8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff870);
    testing::Message::~Message((Message *)0x5e476b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5e47c3);
  local_234 = pbrt::Pow<13>((float)((ulong)in_stack_fffffffffffff870 >> 0x20));
  local_238 = 0x2000;
  testing::internal::EqHelper<false>::Compare<float,int>
            (in_stack_fffffffffffff888,in_stack_fffffffffffff880,
             (float *)CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878),
             (int *)in_stack_fffffffffffff870);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_230);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x5e4886);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff8a0,type,
               (char *)CONCAT17(in_stack_fffffffffffff897,in_stack_fffffffffffff890),
               (int)((ulong)in_stack_fffffffffffff888 >> 0x20),in_stack_fffffffffffff880);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
               in_stack_fffffffffffff8e8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff870);
    testing::Message::~Message((Message *)0x5e48e9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5e4941);
  local_25c = pbrt::Pow<14>((float)((ulong)in_stack_fffffffffffff870 >> 0x20));
  local_260 = 0x4000;
  testing::internal::EqHelper<false>::Compare<float,int>
            (in_stack_fffffffffffff888,in_stack_fffffffffffff880,
             (float *)CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878),
             (int *)in_stack_fffffffffffff870);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_258);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x5e4a04);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff8a0,type,
               (char *)CONCAT17(in_stack_fffffffffffff897,in_stack_fffffffffffff890),
               (int)((ulong)in_stack_fffffffffffff888 >> 0x20),in_stack_fffffffffffff880);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
               in_stack_fffffffffffff8e8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff870);
    testing::Message::~Message((Message *)0x5e4a67);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5e4abf);
  local_284 = pbrt::Pow<15>((float)((ulong)in_stack_fffffffffffff870 >> 0x20));
  local_288 = 0x8000;
  testing::internal::EqHelper<false>::Compare<float,int>
            (in_stack_fffffffffffff888,in_stack_fffffffffffff880,
             (float *)CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878),
             (int *)in_stack_fffffffffffff870);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_280);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x5e4b82);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff8a0,type,
               (char *)CONCAT17(in_stack_fffffffffffff897,in_stack_fffffffffffff890),
               (int)((ulong)in_stack_fffffffffffff888 >> 0x20),in_stack_fffffffffffff880);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
               in_stack_fffffffffffff8e8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff870);
    testing::Message::~Message((Message *)0x5e4be5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5e4c3d);
  local_2ac = pbrt::Pow<16>((float)((ulong)in_stack_fffffffffffff870 >> 0x20));
  local_2b0 = 0x10000;
  testing::internal::EqHelper<false>::Compare<float,int>
            (in_stack_fffffffffffff888,in_stack_fffffffffffff880,
             (float *)CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878),
             (int *)in_stack_fffffffffffff870);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2a8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x5e4d00);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff8a0,type,
               (char *)CONCAT17(in_stack_fffffffffffff897,in_stack_fffffffffffff890),
               (int)((ulong)in_stack_fffffffffffff888 >> 0x20),in_stack_fffffffffffff880);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
               in_stack_fffffffffffff8e8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff870);
    testing::Message::~Message((Message *)0x5e4d63);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5e4dbb);
  local_2d4 = pbrt::Pow<17>((float)((ulong)in_stack_fffffffffffff870 >> 0x20));
  local_2d8 = 0x20000;
  testing::internal::EqHelper<false>::Compare<float,int>
            (in_stack_fffffffffffff888,in_stack_fffffffffffff880,
             (float *)CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878),
             (int *)in_stack_fffffffffffff870);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2d0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x5e4e7e);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff8a0,type,
               (char *)CONCAT17(in_stack_fffffffffffff897,in_stack_fffffffffffff890),
               (int)((ulong)in_stack_fffffffffffff888 >> 0x20),in_stack_fffffffffffff880);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
               in_stack_fffffffffffff8e8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff870);
    testing::Message::~Message((Message *)0x5e4ee1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5e4f39);
  local_2fc = pbrt::Pow<18>((float)((ulong)in_stack_fffffffffffff870 >> 0x20));
  local_300 = 0x40000;
  testing::internal::EqHelper<false>::Compare<float,int>
            (in_stack_fffffffffffff888,in_stack_fffffffffffff880,
             (float *)CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878),
             (int *)in_stack_fffffffffffff870);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x5e4ffc);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff8a0,type,
               (char *)CONCAT17(in_stack_fffffffffffff897,in_stack_fffffffffffff890),
               (int)((ulong)in_stack_fffffffffffff888 >> 0x20),in_stack_fffffffffffff880);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
               in_stack_fffffffffffff8e8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff870);
    testing::Message::~Message((Message *)0x5e505f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5e50b7);
  local_324 = pbrt::Pow<19>((float)((ulong)in_stack_fffffffffffff870 >> 0x20));
  local_328 = 0x80000;
  testing::internal::EqHelper<false>::Compare<float,int>
            (in_stack_fffffffffffff888,in_stack_fffffffffffff880,
             (float *)CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878),
             (int *)in_stack_fffffffffffff870);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_320);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x5e517a);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff8a0,type,
               (char *)CONCAT17(in_stack_fffffffffffff897,in_stack_fffffffffffff890),
               (int)((ulong)in_stack_fffffffffffff888 >> 0x20),in_stack_fffffffffffff880);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
               in_stack_fffffffffffff8e8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff870);
    testing::Message::~Message((Message *)0x5e51dd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5e5235);
  local_34c = pbrt::Pow<20>((float)((ulong)in_stack_fffffffffffff870 >> 0x20));
  local_350 = 0x100000;
  testing::internal::EqHelper<false>::Compare<float,int>
            (in_stack_fffffffffffff888,in_stack_fffffffffffff880,
             (float *)CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878),
             (int *)in_stack_fffffffffffff870);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_348);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x5e52f8);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff8a0,type,
               (char *)CONCAT17(in_stack_fffffffffffff897,in_stack_fffffffffffff890),
               (int)((ulong)in_stack_fffffffffffff888 >> 0x20),in_stack_fffffffffffff880);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
               in_stack_fffffffffffff8e8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff870);
    testing::Message::~Message((Message *)0x5e535b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5e53b3);
  local_374 = pbrt::Pow<21>((float)((ulong)in_stack_fffffffffffff870 >> 0x20));
  local_378 = 0x200000;
  testing::internal::EqHelper<false>::Compare<float,int>
            (in_stack_fffffffffffff888,in_stack_fffffffffffff880,
             (float *)CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878),
             (int *)in_stack_fffffffffffff870);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_370);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x5e5476);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff8a0,type,
               (char *)CONCAT17(in_stack_fffffffffffff897,in_stack_fffffffffffff890),
               (int)((ulong)in_stack_fffffffffffff888 >> 0x20),in_stack_fffffffffffff880);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
               in_stack_fffffffffffff8e8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff870);
    testing::Message::~Message((Message *)0x5e54d9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5e5531);
  local_39c = pbrt::Pow<22>((float)((ulong)in_stack_fffffffffffff870 >> 0x20));
  local_3a0 = 0x400000;
  testing::internal::EqHelper<false>::Compare<float,int>
            (in_stack_fffffffffffff888,in_stack_fffffffffffff880,
             (float *)CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878),
             (int *)in_stack_fffffffffffff870);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_398);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x5e55f4);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff8a0,type,
               (char *)CONCAT17(in_stack_fffffffffffff897,in_stack_fffffffffffff890),
               (int)((ulong)in_stack_fffffffffffff888 >> 0x20),in_stack_fffffffffffff880);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
               in_stack_fffffffffffff8e8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff870);
    testing::Message::~Message((Message *)0x5e5657);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5e56af);
  local_3c4 = pbrt::Pow<23>((float)((ulong)in_stack_fffffffffffff870 >> 0x20));
  local_3c8 = 0x800000;
  testing::internal::EqHelper<false>::Compare<float,int>
            (in_stack_fffffffffffff888,in_stack_fffffffffffff880,
             (float *)CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878),
             (int *)in_stack_fffffffffffff870);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3c0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x5e5772);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff8a0,type,
               (char *)CONCAT17(in_stack_fffffffffffff897,in_stack_fffffffffffff890),
               (int)((ulong)in_stack_fffffffffffff888 >> 0x20),in_stack_fffffffffffff880);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
               in_stack_fffffffffffff8e8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff870);
    testing::Message::~Message((Message *)0x5e57d5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5e582d);
  local_3ec = pbrt::Pow<24>((float)((ulong)in_stack_fffffffffffff870 >> 0x20));
  local_3f0 = 0x1000000;
  this_03 = local_3e8;
  testing::internal::EqHelper<false>::Compare<float,int>
            (in_stack_fffffffffffff888,in_stack_fffffffffffff880,
             (float *)CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878),
             (int *)in_stack_fffffffffffff870);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(this_03);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x5e58f0);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff8a0,type,
               (char *)CONCAT17(in_stack_fffffffffffff897,in_stack_fffffffffffff890),
               (int)((ulong)in_stack_fffffffffffff888 >> 0x20),in_stack_fffffffffffff880);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffff8f0),(Message *)this_03);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff870);
    testing::Message::~Message((Message *)0x5e594d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5e59a2);
  local_414 = pbrt::Pow<25>((float)((ulong)in_stack_fffffffffffff870 >> 0x20));
  local_418 = 0x2000000;
  testing::internal::EqHelper<false>::Compare<float,int>
            (in_stack_fffffffffffff888,in_stack_fffffffffffff880,
             (float *)CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878),
             (int *)in_stack_fffffffffffff870);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_410);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x5e5a59);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff8a0,type,
               (char *)CONCAT17(in_stack_fffffffffffff897,in_stack_fffffffffffff890),
               (int)((ulong)in_stack_fffffffffffff888 >> 0x20),in_stack_fffffffffffff880);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffff8f0),(Message *)this_03);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff870);
    testing::Message::~Message((Message *)0x5e5ab6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5e5b0b);
  local_43c = pbrt::Pow<26>((float)((ulong)in_stack_fffffffffffff870 >> 0x20));
  local_440 = 0x4000000;
  testing::internal::EqHelper<false>::Compare<float,int>
            (in_stack_fffffffffffff888,in_stack_fffffffffffff880,
             (float *)CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878),
             (int *)in_stack_fffffffffffff870);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_438);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x5e5bc2);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff8a0,type,
               (char *)CONCAT17(in_stack_fffffffffffff897,in_stack_fffffffffffff890),
               (int)((ulong)in_stack_fffffffffffff888 >> 0x20),in_stack_fffffffffffff880);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffff8f0),(Message *)this_03);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff870);
    testing::Message::~Message((Message *)0x5e5c1f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5e5c74);
  local_464 = pbrt::Pow<27>((float)((ulong)in_stack_fffffffffffff870 >> 0x20));
  local_468 = 0x8000000;
  this_02 = local_460;
  testing::internal::EqHelper<false>::Compare<float,int>
            (in_stack_fffffffffffff888,in_stack_fffffffffffff880,
             (float *)CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878),
             (int *)in_stack_fffffffffffff870);
  iVar5 = (int)((ulong)in_stack_fffffffffffff888 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x5e5d2b);
    type = (Type)((ulong)pcVar4 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,type,
               (char *)CONCAT17(in_stack_fffffffffffff897,in_stack_fffffffffffff890),iVar5,
               in_stack_fffffffffffff880);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffff8f0),(Message *)this_03);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff870);
    testing::Message::~Message((Message *)0x5e5d88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5e5ddd);
  local_48c = pbrt::Pow<28>((float)((ulong)in_stack_fffffffffffff870 >> 0x20));
  local_490 = 0x10000000;
  this_01 = local_488;
  testing::internal::EqHelper<false>::Compare<float,int>
            (&this_01->success_,in_stack_fffffffffffff880,
             (float *)CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878),
             (int *)in_stack_fffffffffffff870);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)this_02);
    in_stack_fffffffffffff880 =
         testing::AssertionResult::failure_message((AssertionResult *)0x5e5e94);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,type,(char *)CONCAT17(uVar3,in_stack_fffffffffffff890),
               (int)((ulong)this_01 >> 0x20),in_stack_fffffffffffff880);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffff8f0),(Message *)this_03);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff870);
    testing::Message::~Message((Message *)0x5e5ef1);
  }
  v = (float)((ulong)in_stack_fffffffffffff870 >> 0x20);
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5e5f46);
  pbrt::Pow<29>(v);
  this_00 = local_4b0;
  testing::internal::EqHelper<false>::Compare<float,int>
            (&this_01->success_,in_stack_fffffffffffff880,
             (float *)CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878),(int *)this_00);
  iVar5 = (int)((ulong)this_01 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::AssertionResult::failure_message((AssertionResult *)0x5e5ffd);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,type,(char *)CONCAT17(uVar3,in_stack_fffffffffffff890),iVar5,
               in_stack_fffffffffffff880);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffff8f0),(Message *)this_03);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    testing::Message::~Message((Message *)0x5e6058);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5e60ad);
  return;
}

Assistant:

TEST(Math, Pow) {
    EXPECT_EQ(Pow<0>(2.f), 1 << 0);
    EXPECT_EQ(Pow<1>(2.f), 1 << 1);
    EXPECT_EQ(Pow<2>(2.f), 1 << 2);
    // Test remainder of pow template powers to 29
    EXPECT_EQ(Pow<3>(2.f), 1 << 3);
    EXPECT_EQ(Pow<4>(2.f), 1 << 4);
    EXPECT_EQ(Pow<5>(2.f), 1 << 5);
    EXPECT_EQ(Pow<6>(2.f), 1 << 6);
    EXPECT_EQ(Pow<7>(2.f), 1 << 7);
    EXPECT_EQ(Pow<8>(2.f), 1 << 8);
    EXPECT_EQ(Pow<9>(2.f), 1 << 9);
    EXPECT_EQ(Pow<10>(2.f), 1 << 10);
    EXPECT_EQ(Pow<11>(2.f), 1 << 11);
    EXPECT_EQ(Pow<12>(2.f), 1 << 12);
    EXPECT_EQ(Pow<13>(2.f), 1 << 13);
    EXPECT_EQ(Pow<14>(2.f), 1 << 14);
    EXPECT_EQ(Pow<15>(2.f), 1 << 15);
    EXPECT_EQ(Pow<16>(2.f), 1 << 16);
    EXPECT_EQ(Pow<17>(2.f), 1 << 17);
    EXPECT_EQ(Pow<18>(2.f), 1 << 18);
    EXPECT_EQ(Pow<19>(2.f), 1 << 19);
    EXPECT_EQ(Pow<20>(2.f), 1 << 20);
    EXPECT_EQ(Pow<21>(2.f), 1 << 21);
    EXPECT_EQ(Pow<22>(2.f), 1 << 22);
    EXPECT_EQ(Pow<23>(2.f), 1 << 23);
    EXPECT_EQ(Pow<24>(2.f), 1 << 24);
    EXPECT_EQ(Pow<25>(2.f), 1 << 25);
    EXPECT_EQ(Pow<26>(2.f), 1 << 26);
    EXPECT_EQ(Pow<27>(2.f), 1 << 27);
    EXPECT_EQ(Pow<28>(2.f), 1 << 28);
    EXPECT_EQ(Pow<29>(2.f), 1 << 29);
}